

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::EndObject(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *this,SizeType memberCount)

{
  char *pcVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_00;
  size_t size;
  GenericMember<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *__src;
  void *__dest;
  
  __src = internal::Stack<rapidjson::CrtAllocator>::
          Pop<rapidjson::GenericMember<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                    (&this->stack_,(ulong)memberCount);
  pcVar1 = (this->stack_).stackTop_;
  if (0x17 < (ulong)((long)pcVar1 - (long)(this->stack_).stack_)) {
    this_00 = this->allocator_;
    pcVar1[-8] = '\x03';
    pcVar1[-7] = '\0';
    pcVar1[-6] = '\0';
    pcVar1[-5] = '\0';
    if (memberCount == 0) {
      pcVar1[-0x18] = '\0';
      pcVar1[-0x17] = '\0';
      pcVar1[-0x16] = '\0';
      pcVar1[-0x15] = '\0';
      pcVar1[-0x14] = '\0';
      pcVar1[-0x13] = '\0';
      pcVar1[-0x12] = '\0';
      pcVar1[-0x11] = '\0';
    }
    else {
      size = (ulong)memberCount * 0x30;
      __dest = MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(this_00,size);
      *(void **)(pcVar1 + -0x18) = __dest;
      memcpy(__dest,__src,size);
    }
    *(SizeType *)(pcVar1 + -0xc) = memberCount;
    *(SizeType *)(pcVar1 + -0x10) = memberCount;
    return true;
  }
  __assert_fail("GetSize() >= sizeof(T)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/internal/stack.h"
                ,0x78,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() [Allocator = rapidjson::CrtAllocator, T = rapidjson::GenericValue<rapidjson::UTF8<>>]"
               );
}

Assistant:

bool EndObject(SizeType memberCount) {
        typename ValueType::Member* members = stack_.template Pop<typename ValueType::Member>(memberCount);
        stack_.template Top<ValueType>()->SetObjectRaw(members, (SizeType)memberCount, GetAllocator());
        return true;
    }